

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QtCbor::Element>::reserve(QList<QtCbor::Element> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<QtCbor::Element> *pQVar2;
  qsizetype qVar3;
  Element *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QtCbor::Element> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QtCbor::Element> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QtCbor::Element> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QArrayDataPointer<QtCbor::Element> *)capacity((QList<QtCbor::Element> *)0x21b9ef);
  qVar3 = QArrayDataPointer<QtCbor::Element>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar2 - qVar3) {
    QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QtCbor::Element>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_0021bb93;
    QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QtCbor::Element>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QtCbor::Element>::setFlag
                ((QArrayDataPointer<QtCbor::Element> *)0x21ba97,(ArrayOptions)f.i);
      goto LAB_0021bb93;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Element *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QtCbor::Element> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QtCbor::Element>::QArrayDataPointer
            (pQVar2,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar2 = (QArrayDataPointer<QtCbor::Element> *)
           QArrayDataPointer<QtCbor::Element>::operator->(&local_38);
  QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
  b = QArrayDataPointer<QtCbor::Element>::begin((QArrayDataPointer<QtCbor::Element> *)0x21bb17);
  QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
  QArrayDataPointer<QtCbor::Element>::end(pQVar2);
  QtPrivate::QPodArrayOps<QtCbor::Element>::copyAppend
            (in_stack_ffffffffffffff90,b,(Element *)pQVar2);
  pDVar4 = QArrayDataPointer<QtCbor::Element>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QtCbor::Element> *)
         QArrayDataPointer<QtCbor::Element>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar2,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QtCbor::Element>::setFlag
              ((QArrayDataPointer<QtCbor::Element> *)0x21bb7a,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QtCbor::Element>::swap(pQVar2,in_stack_ffffffffffffff78);
  QArrayDataPointer<QtCbor::Element>::~QArrayDataPointer(pQVar2);
LAB_0021bb93:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}